

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_model_component.cpp
# Opt level: O2

bool __thiscall ON_ModelComponent::SetIndex(ON_ModelComponent *this,int component_index)

{
  int iVar1;
  
  if ((this->m_locked_status & 0x10) == 0) {
    iVar1 = this->m_component_index;
    *(byte *)&this->m_set_status = (byte)this->m_set_status | 0x10;
    this->m_component_index = component_index;
    if (iVar1 != component_index) {
      this->m_content_version_number = this->m_content_version_number + 1;
    }
  }
  return (this->m_locked_status & 0x10) == 0;
}

Assistant:

bool ON_ModelComponent::SetIndex(
  int component_index
  )
{
  const unsigned int bit = ON_ModelComponent::Attributes::IndexAttribute;
  if (0 != (bit & m_locked_status))
    return false;

  const bool bContentChange = (m_component_index !=  component_index);

  m_component_index = component_index;
  m_set_status |= bit;

  if ( bContentChange )
    IncrementContentVersionNumber();

  return true;
}